

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O1

int lj_cf_coroutine_status(lua_State *L)

{
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar1;
  lua_State *plVar2;
  char *str;
  
  if ((L->base < L->top) && (aVar1 = L->base->field_4, aVar1.it >> 0xf == 0x1fff9)) {
    plVar2 = (lua_State *)((ulong)aVar1 & 0x7fffffffffff);
    if (plVar2 == L) {
      str = anon_var_dwarf_5c5b9 + 0x3b;
    }
    else if (plVar2->status == '\0') {
      if ((TValue *)((plVar2->stack).ptr64 + 0x10) < plVar2->base) {
        str = "normal";
      }
      else {
        str = "suspended";
        if (plVar2->top == plVar2->base) {
          str = "dead";
        }
      }
    }
    else if (plVar2->status == '\x01') {
      str = "suspended";
    }
    else {
      str = "dead";
    }
    lua_pushstring(L,str);
    return 1;
  }
  lj_err_arg(L,1,LJ_ERR_NOCORO);
}

Assistant:

LJLIB_CF(coroutine_status)
{
  const char *s;
  lua_State *co;
  if (!(L->top > L->base && tvisthread(L->base)))
    lj_err_arg(L, 1, LJ_ERR_NOCORO);
  co = threadV(L->base);
  if (co == L) s = "running";
  else if (co->status == LUA_YIELD) s = "suspended";
  else if (co->status != LUA_OK) s = "dead";
  else if (co->base > tvref(co->stack)+1+LJ_FR2) s = "normal";
  else if (co->top == co->base) s = "dead";
  else s = "suspended";
  lua_pushstring(L, s);
  return 1;
}